

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

QSystemError createDirectoryWithParents(QByteArray *path,mode_t mode)

{
  bool bVar1;
  char cVar2;
  anon_class_16_2_3fa7beb7 *this;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  qsizetype slash;
  QByteArray parentPath;
  QSystemError result;
  anon_class_16_2_3fa7beb7 tryMkDir;
  QByteArray *in_stack_ffffffffffffff88;
  QByteArray *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  anon_class_16_2_3fa7beb7 *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  QSystemError local_28;
  QSystemError local_20;
  undefined4 local_10;
  undefined4 uStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _local_10 = CONCAT44(0xaaaaaaaa,in_ESI);
  local_28.errorCode = -0x55555556;
  local_28.errorScope = 0xaaaaaaaa;
  local_28 = createDirectoryWithParents::anon_class_16_2_3fa7beb7::operator()
                       (in_stack_ffffffffffffffa0);
  bVar1 = QSystemError::ok(&local_28);
  if (bVar1) {
    local_20 = local_28;
  }
  else if (local_28.errorCode == 2) {
    this = (anon_class_16_2_3fa7beb7 *)
           QByteArray::lastIndexOf
                     ((QByteArray *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char)((ulong)in_stack_ffffffffffffff90 >> 0x38),
                      (qsizetype)in_stack_ffffffffffffff88);
    while( true ) {
      bVar1 = false;
      if (0 < (long)this) {
        cVar2 = QByteArray::operator[](in_stack_ffffffffffffff88,0x1890a1);
        bVar1 = cVar2 == '/';
      }
      if (!bVar1) break;
      this = (anon_class_16_2_3fa7beb7 *)&this[-1].field_0xf;
    }
    if ((long)this < 1) {
      local_20 = local_28;
    }
    else {
      QByteArray::first(in_stack_ffffffffffffff90,(qsizetype)in_stack_ffffffffffffff88);
      local_28 = createDirectoryWithParents
                           ((QByteArray *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8),
                            (mode_t)((ulong)this >> 0x20));
      bVar1 = QSystemError::ok(&local_28);
      if (bVar1) {
        local_20 = createDirectoryWithParents::anon_class_16_2_3fa7beb7::operator()(this);
      }
      else {
        local_20 = local_28;
      }
      QByteArray::~QByteArray((QByteArray *)0x189177);
    }
  }
  else {
    local_20 = local_28;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

static QSystemError createDirectoryWithParents(const QByteArray &path, mode_t mode)
{
#ifdef Q_OS_WASM
    if (path == "/")
        return {};
#endif

    auto tryMkDir = [&path, mode]() -> QSystemError {
        if (QT_MKDIR(path, mode) == 0) {
#ifdef Q_OS_VXWORKS
            forceRequestedPermissionsOnVxWorks(path, mode);
#endif
            return {};
        }
        // On macOS with APFS mkdir sets errno to EISDIR, QTBUG-97110
        if (errno == EISDIR)
            return {};
        if (errno == EEXIST || errno == EROFS) {
            // ::mkdir() can fail if the dir already exists (it may have been
            // created by another thread or another process)
            QT_STATBUF st;
            if (QT_STAT(path.constData(), &st) != 0)
                return QSystemError::stdError(errno);
            const bool isDir = (st.st_mode & S_IFMT) == S_IFDIR;
            return isDir ? QSystemError{} : QSystemError::stdError(EEXIST);
        }
        return QSystemError::stdError(errno);
    };

    QSystemError result = tryMkDir();
    if (result.ok())
        return result;

    // Only handle non-existing dir components in the path
    if (result.errorCode != ENOENT)
        return result;

    qsizetype slash = path.lastIndexOf('/');
    while (slash > 0 && path[slash - 1] == '/')
        --slash;

    if (slash < 1)
        return result;

    // mkdir failed because the parent dir doesn't exist, so try to create it
    QByteArray parentPath = path.first(slash);
    if (result = createDirectoryWithParents(parentPath, mode); !result.ok())
        return result;

    // try again
    return tryMkDir();
}